

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

void greetable_skeleton_set_property(GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  undefined8 *puVar1;
  gboolean gVar2;
  GType GVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  
  GVar3 = greetable_skeleton_get_type();
  lVar4 = g_type_check_instance_cast(object,GVar3);
  if (prop_id != 1) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O1/basics_gen.c"
               ,0x580,"greetable_skeleton_set_property","prop_id != 0 && prop_id - 1 < 1");
  }
  g_mutex_lock(*(long *)(lVar4 + 0x20) + 0x20);
  g_object_freeze_notify(object);
  gVar2 = _g_value_equal(value,(GValue *)**(undefined8 **)(lVar4 + 0x20));
  if (gVar2 == 0) {
    uVar5 = g_dbus_interface_skeleton_get_type();
    uVar5 = g_type_check_instance_cast(lVar4,uVar5);
    lVar6 = g_dbus_interface_skeleton_get_connection(uVar5);
    if (lVar6 != 0) {
      puVar8 = *(undefined8 **)(lVar4 + 0x20);
      puVar1 = (undefined8 *)*puVar8;
      do {
        puVar8 = (undefined8 *)puVar8[1];
        plVar7 = (long *)0x0;
        if (puVar8 == (undefined8 *)0x0) break;
        plVar7 = (long *)*puVar8;
      } while ((_ExtendedGDBusPropertyInfo *)*plVar7 != &_greetable_property_info_greeting);
      if (plVar7 == (long *)0x0) {
        puVar8 = (undefined8 *)g_malloc0(0x28);
        *(undefined4 *)(puVar8 + 1) = 1;
        *puVar8 = &_greetable_property_info_greeting;
        uVar5 = g_list_prepend(*(undefined8 *)(*(long *)(lVar4 + 0x20) + 8));
        *(undefined8 *)(*(long *)(lVar4 + 0x20) + 8) = uVar5;
        g_value_init(puVar8 + 2,*puVar1);
        g_value_copy(puVar1,puVar8 + 2);
      }
    }
    g_value_copy(value,**(undefined8 **)(lVar4 + 0x20));
    g_object_notify_by_pspec(object,pspec);
  }
  g_mutex_unlock(*(long *)(lVar4 + 0x20) + 0x20);
  g_object_thaw_notify(object);
  return;
}

Assistant:

static void
greetable_skeleton_set_property (GObject      *object,
  guint         prop_id,
  const GValue *value,
  GParamSpec   *pspec)
{
  const _ExtendedGDBusPropertyInfo *info;
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  g_assert (prop_id != 0 && prop_id - 1 < 1);
  info = (const _ExtendedGDBusPropertyInfo *) _greetable_property_info_pointers[prop_id - 1];
  g_mutex_lock (&skeleton->priv->lock);
  g_object_freeze_notify (object);
  if (!_g_value_equal (value, &skeleton->priv->properties[prop_id - 1]))
    {
      if (g_dbus_interface_skeleton_get_connection (G_DBUS_INTERFACE_SKELETON (skeleton)) != NULL &&
          info->emits_changed_signal)
        _greetable_schedule_emit_changed (skeleton, info, prop_id, &skeleton->priv->properties[prop_id - 1]);
      g_value_copy (value, &skeleton->priv->properties[prop_id - 1]);
      g_object_notify_by_pspec (object, pspec);
    }
  g_mutex_unlock (&skeleton->priv->lock);
  g_object_thaw_notify (object);
}